

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::CommandPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  undefined4 in_register_0000000c;
  Parameters params_local;
  string local_98;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_78;
  Environment env;
  
  params_local.flags = (VkCommandPoolCreateFlags)context;
  Environment::Environment(&env,(Context *)this,1);
  CommandPool::create((Move<vk::Handle<(vk::HandleType)24>_> *)&local_78,&env,
                      (Resources *)&params_local,
                      (Parameters *)CONCAT44(in_register_0000000c,params.flags));
  local_98.field_2._M_allocated_capacity = (size_type)local_78.m_data.deleter.m_device;
  local_98.field_2._8_8_ = local_78.m_data.deleter.m_allocator;
  local_98._M_dataplus._M_p = (pointer)local_78.m_data.object.m_internal;
  local_98._M_string_length = (size_type)local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Ok",(allocator<char> *)&local_78);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}